

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmStrCat<std::__cxx11::string,char[9],std::__cxx11::string,std::__cxx11::string,char[13],std::__cxx11::string>
                   (string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                   char (*args_1) [9],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
                   char (*args_4) [13],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  cmAlphaNum local_1e8;
  cmAlphaNum local_1b8;
  cmAlphaNum local_188;
  cmAlphaNum local_158;
  cmAlphaNum local_128;
  cmAlphaNum local_f8;
  string_view local_c8;
  string_view local_b8;
  string_view local_a8;
  string_view local_98;
  string_view local_88;
  string_view local_78;
  string_view local_68;
  string_view local_58;
  iterator local_48;
  undefined8 local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_2;
  char (*args_local_1) [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  cmAlphaNum *b_local;
  cmAlphaNum *a_local;
  
  local_38 = args_2;
  args_local_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1;
  args_local_1 = (char (*) [9])args;
  args_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)b;
  b_local = a;
  a_local = (cmAlphaNum *)__return_storage_ptr__;
  local_c8 = cmAlphaNum::View(a);
  local_b8 = cmAlphaNum::View((cmAlphaNum *)args_local);
  cmAlphaNum::cmAlphaNum(&local_f8,(string *)args_local_1);
  local_a8 = cmAlphaNum::View(&local_f8);
  cmAlphaNum::cmAlphaNum(&local_128,(char *)args_local_2);
  local_98 = cmAlphaNum::View(&local_128);
  cmAlphaNum::cmAlphaNum(&local_158,local_38);
  local_88 = cmAlphaNum::View(&local_158);
  cmAlphaNum::cmAlphaNum(&local_188,args_3);
  local_78 = cmAlphaNum::View(&local_188);
  cmAlphaNum::cmAlphaNum(&local_1b8,*args_4);
  local_68 = cmAlphaNum::View(&local_1b8);
  cmAlphaNum::cmAlphaNum(&local_1e8,args_5);
  local_58 = cmAlphaNum::View(&local_1e8);
  local_48 = &local_c8;
  local_40 = 8;
  views._M_len = 8;
  views._M_array = local_48;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}